

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGBToAR30Row_C(uint8_t *src_argb,uint8_t *dst_ar30,int width)

{
  long lVar1;
  
  if (0 < width) {
    lVar1 = 0;
    do {
      *(uint *)(dst_ar30 + lVar1 * 4) =
           (src_argb[lVar1 * 4 + 3] & 0xffffffc0) << 0x18 |
           (src_argb[lVar1 * 4 + 2] & 0xc0) << 0xe | (uint)src_argb[lVar1 * 4 + 2] << 0x16 |
           (src_argb[lVar1 * 4 + 1] & 0xc0) << 4 | (uint)src_argb[lVar1 * 4 + 1] << 0xc |
           (uint)(src_argb[lVar1 * 4] >> 6) + (uint)src_argb[lVar1 * 4] * 4;
      lVar1 = lVar1 + 1;
    } while (width != (int)lVar1);
  }
  return;
}

Assistant:

void ARGBToAR30Row_C(const uint8_t* src_argb, uint8_t* dst_ar30, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint32_t b0 = (src_argb[0] >> 6) | ((uint32_t)(src_argb[0]) << 2);
    uint32_t g0 = (src_argb[1] >> 6) | ((uint32_t)(src_argb[1]) << 2);
    uint32_t r0 = (src_argb[2] >> 6) | ((uint32_t)(src_argb[2]) << 2);
    uint32_t a0 = (src_argb[3] >> 6);
    *(uint32_t*)(dst_ar30) = b0 | (g0 << 10) | (r0 << 20) | (a0 << 30);
    dst_ar30 += 4;
    src_argb += 4;
  }
}